

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1195::run(TestCase1195 *this)

{
  ListElementCount LVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint i;
  undefined1 auVar6 [16];
  Orphanage OVar8;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar9;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  uint local_1a0;
  ListElementCount local_19c;
  ListReader local_198;
  OrphanBuilder local_168;
  ListBuilder local_148;
  MallocMessageBuilder local_120;
  long lVar7;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  OVar8 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_198,OVar8.arena,OVar8.capTable,7,FOUR_BYTES);
  local_168.segment = (SegmentBuilder *)local_198.capTable;
  local_168.capTable = (CapTableBuilder *)local_198.ptr;
  local_168.tag.content = (uint64_t)local_198.segment;
  OrphanBuilder::asList(&local_148,&local_168,FOUR_BYTES);
  auVar2 = _DAT_002b7a00;
  lVar4 = -8;
  uVar5 = 0;
  auVar6 = _DAT_002b79f0;
  do {
    if (SUB164(auVar6 ^ auVar2,4) == -0x80000000 && SUB164(auVar6 ^ auVar2,0) < -0x7ffffff9) {
      *(int *)(local_148.ptr + (uVar5 >> 3)) = (int)lVar4 + 0x75bcd1d;
      *(int *)(local_148.ptr + (local_148.step + uVar5 >> 3)) = (int)lVar4 + 0x75bcd1e;
    }
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar7 + 2;
    uVar5 = uVar5 + (ulong)local_148.step * 2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0);
  AVar9 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
  if (((AVar9.ptr)->size_ != 5) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 5;
    AVar9 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
    local_198.segment = (SegmentReader *)(AVar9.ptr)->size_;
    kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b3,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               (int *)&local_1a0,(unsigned_long *)&local_198);
  }
  OrphanBuilder::truncate(&local_168,(char *)0x3,4);
  AVar9 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
  if (((AVar9.ptr)->size_ != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 3;
    AVar9 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
    local_198.segment = (SegmentReader *)(AVar9.ptr)->size_;
    kj::_::Debug::log<char_const(&)[67],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b5,ERROR,
               "\"failed: expected \" \"(3) == (message.getSegmentsForOutput()[0].size())\", 3, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (3) == (message.getSegmentsForOutput()[0].size())",
               (int *)&local_1a0,(unsigned_long *)&local_198);
  }
  OrphanBuilder::asListReader(&local_198,&local_168,FOUR_BYTES);
  if ((local_198.elementCount != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 3;
    local_19c = local_198.elementCount;
    kj::_::Debug::log<char_const(&)[40],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4b8,ERROR,"\"failed: expected \" \"(3) == (reader.size())\", 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",(int *)&local_1a0,&local_19c
              );
  }
  uVar5 = 0x75bcd15;
  do {
    uVar3 = (ulong)local_148.step * (uVar5 - 0x75bcd15) >> 3;
    if (kj::_::Debug::minSeverity < 3 && uVar5 != *(uint *)(local_148.ptr + uVar3)) {
      local_19c = *(ListElementCount *)(local_148.ptr + uVar3);
      local_1a0 = (uint)uVar5;
      kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bb,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (builder[i])\", 123456789 + i, builder[i]"
                 ,(char (*) [49])"failed: expected (123456789 + i) == (builder[i])",&local_1a0,
                 &local_19c);
    }
    uVar3 = (uVar5 - 0x75bcd15) * (ulong)local_198.step >> 3;
    if ((uVar5 != *(uint *)((long)&((CapTableReader *)local_198.ptr)->_vptr_CapTableReader + uVar3))
       && (kj::_::Debug::minSeverity < 3)) {
      local_19c = *(ListElementCount *)
                   ((long)&((CapTableReader *)local_198.ptr)->_vptr_CapTableReader + uVar3);
      local_1a0 = (uint)uVar5;
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bc,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&local_1a0,
                 &local_19c);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x75bcd18);
  lVar4 = 3;
  do {
    uVar5 = (ulong)local_148.step * lVar4 >> 3;
    if ((*(int *)(local_148.ptr + uVar5) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1a0 = 0;
      local_19c = *(ListElementCount *)(local_148.ptr + uVar5);
      kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4bf,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_1a0,&local_19c)
      ;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  local_148.ptr[0] = 'A';
  local_148.ptr[1] = '\x01';
  local_148.ptr[2] = '\0';
  local_148.ptr[3] = '\0';
  LVar1 = *(ListElementCount *)&((CapTableReader *)local_198.ptr)->_vptr_CapTableReader;
  if ((LVar1 != 0x141) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0 = 0x141;
    local_19c = LVar1;
    kj::_::Debug::log<char_const(&)[38],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4c5,ERROR,"\"failed: expected \" \"(321) == (reader[0])\", 321, reader[0]",
               (char (*) [38])"failed: expected (321) == (reader[0])",(int *)&local_1a0,&local_19c);
  }
  if (local_168.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, TruncatePrimitiveList) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());
  orphan.truncate(3);
  EXPECT_EQ(3, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(123456789 + i, builder[i]);
    EXPECT_EQ(123456789 + i, reader[i]);
  }
  for (uint i = 3; i < 7; i++) {
    EXPECT_EQ(0, builder[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(321, reader[0]);
}